

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mv_prec.c
# Opt level: O0

int_mv get_ref_mv_for_mv_stats
                 (MB_MODE_INFO *mbmi,MB_MODE_INFO_EXT_FRAME *mbmi_ext_frame,int ref_idx)

{
  int8_t iVar1;
  int in_EDX;
  long in_RSI;
  long in_RDI;
  CANDIDATE_MV *curr_ref_mv_stack;
  int8_t ref_frame_type;
  MV_REFERENCE_FRAME *ref_frames;
  int ref_mv_idx;
  MV_REFERENCE_FRAME *in_stack_ffffffffffffffc8;
  undefined4 local_20;
  undefined4 local_4;
  
  local_20 = (uint)((byte)(*(ushort *)(in_RDI + 0xa7) >> 4) & 3);
  if ((*(char *)(in_RDI + 2) == '\x15') || (*(char *)(in_RDI + 2) == '\x16')) {
    local_20 = local_20 + 1;
  }
  iVar1 = av1_ref_frame_type(in_stack_ffffffffffffffc8);
  if (*(char *)(in_RDI + 0x11) < '\x01') {
    if (local_20 < *(byte *)(in_RSI + 0x28)) {
      local_4 = *(int_mv *)(in_RSI + (long)(int)local_20 * 8);
    }
    else {
      local_4 = *(int_mv *)(in_RSI + 0x2c + (long)iVar1 * 4);
    }
  }
  else if (in_EDX == 0) {
    local_4 = *(int_mv *)(in_RSI + (long)(int)local_20 * 8);
  }
  else {
    local_4 = *(int_mv *)(in_RSI + 4 + (long)(int)local_20 * 8);
  }
  return (int_mv)local_4.as_int;
}

Assistant:

static inline int_mv get_ref_mv_for_mv_stats(
    const MB_MODE_INFO *mbmi, const MB_MODE_INFO_EXT_FRAME *mbmi_ext_frame,
    int ref_idx) {
  int ref_mv_idx = mbmi->ref_mv_idx;
  if (mbmi->mode == NEAR_NEWMV || mbmi->mode == NEW_NEARMV) {
    assert(has_second_ref(mbmi));
    ref_mv_idx += 1;
  }

  const MV_REFERENCE_FRAME *ref_frames = mbmi->ref_frame;
  const int8_t ref_frame_type = av1_ref_frame_type(ref_frames);
  const CANDIDATE_MV *curr_ref_mv_stack = mbmi_ext_frame->ref_mv_stack;

  if (ref_frames[1] > INTRA_FRAME) {
    assert(ref_idx == 0 || ref_idx == 1);
    return ref_idx ? curr_ref_mv_stack[ref_mv_idx].comp_mv
                   : curr_ref_mv_stack[ref_mv_idx].this_mv;
  }

  assert(ref_idx == 0);
  return ref_mv_idx < mbmi_ext_frame->ref_mv_count
             ? curr_ref_mv_stack[ref_mv_idx].this_mv
             : mbmi_ext_frame->global_mvs[ref_frame_type];
}